

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_color.c
# Opt level: O1

int gdColorMatch(gdImagePtr im,int col1,int col2,float threshold)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (im->trueColor == 0) {
    uVar2 = im->red[col1];
    uVar6 = im->red[col2];
    uVar4 = im->green[col1];
    uVar5 = im->green[col2];
    uVar7 = im->blue[col1];
    uVar8 = im->blue[col2];
    uVar1 = im->alpha[col1];
    uVar3 = im->alpha[col2];
  }
  else {
    uVar2 = (uint)col1 >> 0x10 & 0xff;
    uVar6 = (uint)col2 >> 0x10 & 0xff;
    uVar4 = (uint)col1 >> 8 & 0xff;
    uVar5 = (uint)col2 >> 8 & 0xff;
    uVar7 = col1 & 0xff;
    uVar8 = col2 & 0xff;
    uVar1 = (uint)col1 >> 0x18 & 0x7f;
    uVar3 = (uint)col2 >> 0x18 & 0x7f;
  }
  return (uint)(((float)(int)((uVar1 - uVar3) * (uVar1 - uVar3) +
                             (uVar7 - uVar8) * (uVar7 - uVar8) + (uVar4 - uVar5) * (uVar4 - uVar5) +
                             (uVar2 - uVar6) * (uVar2 - uVar6)) * 100.0) / 195075.0 < threshold);
}

Assistant:

int gdColorMatch(gdImagePtr im, int col1, int col2, float threshold)
{
	const int dr = gdImageRed(im, col1) - gdImageRed(im, col2);
	const int dg = gdImageGreen(im, col1) - gdImageGreen(im, col2);
	const int db = gdImageBlue(im, col1) - gdImageBlue(im, col2);
	const int da = gdImageAlpha(im, col1) - gdImageAlpha(im, col2);
	const int dist = dr * dr + dg * dg + db * db + da * da;

	return (100.0 * dist / 195075) < threshold;
}